

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueRelations.cpp
# Opt level: O3

void __thiscall
dg::vr::ValueRelations::add
          (ValueRelations *this,V val,Handle h,VectorSet<const_llvm::Value_*> *vals)

{
  _Rb_tree_header *p_Var1;
  iterator iVar2;
  _Base_ptr p_Var3;
  const_iterator __pos;
  V oldVal;
  V local_40;
  key_type local_38;
  V local_30;
  
  p_Var3 = (this->valToBucket)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var1 = &(this->valToBucket)._M_t._M_impl.super__Rb_tree_header;
  __pos._M_node = &p_Var1->_M_header;
  local_40 = val;
  if (p_Var3 != (_Base_ptr)0x0) {
    do {
      if (*(V *)(p_Var3 + 1) >= val) {
        __pos._M_node = p_Var3;
      }
      p_Var3 = (&p_Var3->_M_left)[*(V *)(p_Var3 + 1) < val];
    } while (p_Var3 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)__pos._M_node != p_Var1) && (*(V *)(__pos._M_node + 1) <= val)) {
      local_38._M_data = (Bucket *)__pos._M_node[1]._M_parent;
      if ((local_38._M_data)->id == h->id) {
        return;
      }
      local_30 = *(V *)(__pos._M_node + 1);
      iVar2 = std::
              _Rb_tree<std::reference_wrapper<const_dg::vr::Bucket>,_std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>,_std::_Select1st<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>_>,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>_>_>
              ::find(&(this->bucketToVals)._M_t,&local_38);
      VectorSet<llvm::Value_const*>::erase<llvm::Value_const*,bool>
                ((VectorSet<llvm::Value_const*> *)&iVar2._M_node[1]._M_parent,&local_30);
      __pos._M_node[1]._M_parent = (_Base_ptr)h;
      goto LAB_0012c87b;
    }
  }
  std::
  _Rb_tree<llvm::Value_const*,std::pair<llvm::Value_const*const,std::reference_wrapper<dg::vr::Bucket_const>>,std::_Select1st<std::pair<llvm::Value_const*const,std::reference_wrapper<dg::vr::Bucket_const>>>,std::less<llvm::Value_const*>,std::allocator<std::pair<llvm::Value_const*const,std::reference_wrapper<dg::vr::Bucket_const>>>>
  ::_M_emplace_hint_unique<llvm::Value_const*&,dg::vr::Bucket_const&>
            ((_Rb_tree<llvm::Value_const*,std::pair<llvm::Value_const*const,std::reference_wrapper<dg::vr::Bucket_const>>,std::_Select1st<std::pair<llvm::Value_const*const,std::reference_wrapper<dg::vr::Bucket_const>>>,std::less<llvm::Value_const*>,std::allocator<std::pair<llvm::Value_const*const,std::reference_wrapper<dg::vr::Bucket_const>>>>
              *)&this->valToBucket,__pos,&local_40,h);
LAB_0012c87b:
  VectorSet<llvm::Value_const*>::emplace<llvm::Value_const*&>
            ((VectorSet<llvm::Value_const*> *)vals,&local_40);
  this->changed = true;
  return;
}

Assistant:

void ValueRelations::add(V val, Handle h, VectorSet<V> &vals) {
    ValToBucket::iterator it = valToBucket.lower_bound(val);
    // val already bound to a handle
    if (it != valToBucket.end() && !(valToBucket.key_comp()(val, it->first))) {
        // it is already bound to passed handle
        if (it->second == h)
            return;
        V oldVal = it->first;
        Handle oldH = it->second;
        assert(bucketToVals.find(oldH) != bucketToVals.end());
        assert(bucketToVals.at(oldH).find(oldVal) !=
               bucketToVals.at(oldH).end());
        bucketToVals.find(oldH)->second.erase(oldVal);
        it->second = h;
    } else
        valToBucket.emplace_hint(it, val, h);

    assert(valToBucket.find(val)->second == h);
    vals.emplace(val);
    updateChanged(true);
}